

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O3

void collect_nodes(TreeNode *tn,dl_t nlist)

{
  dl_el *pdVar1;
  dl_el_s *pdVar2;
  uint uVar3;
  dl_el_s *pdVar4;
  dl_el_s *pdVar5;
  dl_el_s *pdVar6;
  
  pdVar4 = (dl_el_s *)malloc(0x18);
  if (pdVar4 == (dl_el_s *)0x0) {
    puts("Out of memory!!");
    pdVar4 = nlist->last;
    if (pdVar4 == (dl_el_s *)0x0) {
      return;
    }
  }
  else {
    pdVar4[1].prev = (dl_el_s *)tn;
    pdVar4->next = (dl_el_s *)0x0;
    uVar3 = nlist->count;
    if (uVar3 == 0) {
      pdVar4->prev = (dl_el_s *)0x0;
      nlist->last = pdVar4;
      nlist->first = pdVar4;
      uVar3 = 1;
    }
    else {
      pdVar1 = nlist->last;
      pdVar4->prev = pdVar1;
      pdVar1->next = pdVar4;
      nlist->last = pdVar4;
      uVar3 = uVar3 + 1;
    }
    nlist->count = uVar3;
  }
  do {
    pdVar6 = (pdVar4[1].prev)->next->prev;
    while (pdVar6 != (dl_el_s *)0x0) {
      pdVar2 = pdVar6[1].prev;
      pdVar6 = pdVar6->next;
      pdVar5 = (dl_el_s *)malloc(0x18);
      if (pdVar5 == (dl_el_s *)0x0) {
        puts("Out of memory!!");
      }
      else {
        pdVar5[1].prev = pdVar2;
        pdVar5->next = (dl_el_s *)0x0;
        uVar3 = nlist->count;
        if (uVar3 == 0) {
          pdVar5->prev = (dl_el_s *)0x0;
          nlist->last = pdVar5;
          nlist->first = pdVar5;
          nlist->count = 1;
        }
        else {
          pdVar1 = nlist->last;
          pdVar5->prev = pdVar1;
          pdVar1->next = pdVar5;
          nlist->last = pdVar5;
          nlist->count = uVar3 + 1;
        }
      }
    }
    pdVar4 = pdVar4->next;
  } while (pdVar4 != (dl_el_s *)0x0);
  return;
}

Assistant:

void collect_nodes(TreeNode* tn, dl_t nlist)
{
  /*
  TreeNode* c;
  
  dl_append(TreeNode*, nlist, tn);
  dl_forall(TreeNode*, tn->children, c) {
    collect_nodes(c, nlist);
  }dl_endfor;
  */
  // non-recursive version
  TreeNode* c;
  dl_el *curr;
  
  dl_append(TreeNode*, nlist, tn);

  for (curr=nlist->last; curr; curr=curr->next) {
    tn = dl_data(TreeNode*, curr);
    dl_forall(TreeNode*, tn->children, c) {
      dl_append(TreeNode*, nlist, c);
    }dl_endfor;
  }
}